

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftinit.c
# Opt level: O3

FT_Error FT_Done_FreeType(FT_Library library)

{
  FT_Memory memory;
  
  if (library != (FT_Library)0x0) {
    memory = library->memory;
    FT_Done_Library(library);
    FT_Done_Memory(memory);
    return 0;
  }
  return 0x21;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Done_FreeType( FT_Library  library )
  {
    FT_Memory  memory;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    memory = library->memory;

    /* Discard the library object */
    FT_Done_Library( library );

    /* discard memory manager */
    FT_Done_Memory( memory );

    return FT_Err_Ok;
  }